

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

uint32_t blockmix_salsa8_xor(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  int *piVar4;
  uint32_t *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  __m128i Y0;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar30;
  uint uVar31;
  __m128i Y1;
  uint uVar32;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i Y3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i Y2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint uVar65;
  __m128i Y3_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  uint uVar67;
  uint uVar78;
  uint uVar79;
  __m128i Y2_1;
  uint uVar80;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i Y1_1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i Y0_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar98;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  uint uVar129;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar130;
  uint uVar131;
  uint uVar159;
  uint uVar160;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  uint uVar161;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  
  lVar9 = r - 1;
  lVar7 = lVar9 * 0x80;
  lVar8 = lVar9 * 2;
  lVar6 = lVar9 * 2;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
  }
  uVar98 = Bin2[lVar8 + 1].w[0] ^ Bin1[lVar6 + 1].w[0];
  uVar126 = *(uint *)((long)Bin2 + lVar7 + 0x44) ^ *(uint *)((long)Bin1 + lVar7 + 0x44);
  uVar127 = *(uint *)((long)Bin2 + lVar7 + 0x48) ^ *(uint *)((long)Bin1 + lVar7 + 0x48);
  uVar129 = *(uint *)((long)Bin2 + lVar7 + 0x4c) ^ *(uint *)((long)Bin1 + lVar7 + 0x4c);
  uVar30 = *(uint *)((long)Bin2 + lVar7 + 0x50) ^ *(uint *)((long)Bin1 + lVar7 + 0x50);
  uVar31 = *(uint *)((long)Bin2 + lVar7 + 0x54) ^ *(uint *)((long)Bin1 + lVar7 + 0x54);
  uVar32 = *(uint *)((long)Bin2 + lVar7 + 0x58) ^ *(uint *)((long)Bin1 + lVar7 + 0x58);
  uVar20 = *(uint *)((long)Bin2 + lVar7 + 0x5c) ^ *(uint *)((long)Bin1 + lVar7 + 0x5c);
  auVar41 = *(undefined1 (*) [16])((long)Bin2 + lVar7 + 0x60) ^
            *(undefined1 (*) [16])((long)Bin1 + lVar7 + 0x60);
  auVar33 = *(undefined1 (*) [16])((long)Bin2 + lVar7 + 0x70) ^
            *(undefined1 (*) [16])((long)Bin1 + lVar7 + 0x70);
  lVar9 = r + (r == 0);
  lVar8 = 0x30;
  do {
    puVar1 = (uint *)((long)Bin1 + lVar8 * 2 + -0x50);
    puVar2 = (uint *)((long)Bin1 + lVar8 * 2 + -0x60);
    puVar3 = (uint *)((long)Bin2 + lVar8 * 2 + -0x60);
    uVar98 = uVar98 ^ *puVar2 ^ *puVar3;
    uVar126 = uVar126 ^ puVar2[1] ^ puVar3[1];
    uVar127 = uVar127 ^ puVar2[2] ^ puVar3[2];
    uVar129 = uVar129 ^ puVar2[3] ^ puVar3[3];
    puVar2 = (uint *)((long)Bin2 + lVar8 * 2 + -0x50);
    uVar30 = uVar30 ^ *puVar1 ^ *puVar2;
    uVar31 = uVar31 ^ puVar1[1] ^ puVar2[1];
    uVar32 = uVar32 ^ puVar1[2] ^ puVar2[2];
    uVar20 = uVar20 ^ puVar1[3] ^ puVar2[3];
    auVar41 = auVar41 ^ *(undefined1 (*) [16])((long)Bin1 + lVar8 * 2 + -0x40) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar8 * 2 + -0x40);
    auVar33 = auVar33 ^ *(undefined1 (*) [16])((long)Bin1 + lVar8 * 2 + -0x30) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar8 * 2 + -0x30);
    uVar67 = auVar33._0_4_ + uVar98;
    uVar78 = auVar33._4_4_ + uVar126;
    uVar79 = auVar33._8_4_ + uVar127;
    uVar80 = auVar33._12_4_ + uVar129;
    uVar131 = (uVar67 * 0x80 | uVar67 >> 0x19) ^ uVar30;
    uVar159 = (uVar78 * 0x80 | uVar78 >> 0x19) ^ uVar31;
    uVar160 = (uVar79 * 0x80 | uVar79 >> 0x19) ^ uVar32;
    uVar161 = (uVar80 * 0x80 | uVar80 >> 0x19) ^ uVar20;
    auVar53._0_4_ = uVar131 + uVar98 >> 0x17;
    auVar53._4_4_ = uVar159 + uVar126 >> 0x17;
    auVar53._8_4_ = uVar160 + uVar127 >> 0x17;
    auVar53._12_4_ = uVar161 + uVar129 >> 0x17;
    auVar81._0_4_ = (uVar131 + uVar98) * 0x200;
    auVar81._4_4_ = (uVar159 + uVar126) * 0x200;
    auVar81._8_4_ = (uVar160 + uVar127) * 0x200;
    auVar81._12_4_ = (uVar161 + uVar129) * 0x200;
    auVar82 = (auVar81 | auVar53) ^ auVar41;
    iVar163 = auVar82._0_4_;
    iVar164 = auVar82._4_4_;
    uVar67 = auVar82._8_4_ + uVar160;
    uVar78 = auVar82._12_4_ + uVar161;
    auVar89._0_4_ = iVar163 + uVar131 >> 0x13;
    auVar89._4_4_ = iVar164 + uVar159 >> 0x13;
    auVar89._8_4_ = uVar67 >> 0x13;
    auVar89._12_4_ = uVar78 >> 0x13;
    auVar54._0_4_ = (iVar163 + uVar131) * 0x2000;
    auVar54._4_4_ = (iVar164 + uVar159) * 0x2000;
    auVar54._8_4_ = uVar67 * 0x2000;
    auVar54._12_4_ = uVar78 * 0x2000;
    auVar55 = (auVar54 | auVar89) ^ auVar33;
    auVar90._0_12_ = auVar55._4_12_;
    auVar90._12_4_ = auVar55._0_4_;
    uVar67 = auVar55._0_4_ + iVar163;
    uVar79 = auVar55._4_4_ + iVar164;
    uVar65 = auVar55._8_4_ + auVar82._8_4_;
    uVar66 = auVar55._12_4_ + auVar82._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar98;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar126;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar127;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar129;
    auVar70._4_4_ = uVar131;
    auVar70._0_4_ = uVar161;
    auVar70._8_4_ = uVar159;
    auVar70._12_4_ = uVar160;
    auVar68._0_8_ = auVar82._8_8_;
    auVar68._8_4_ = iVar163;
    auVar68._12_4_ = iVar164;
    auVar132._0_4_ = (uVar161 + uVar78) * 0x80;
    auVar132._4_4_ = (uVar131 + uVar80) * 0x80;
    auVar132._8_4_ = (uVar159 + uVar128) * 0x80;
    auVar132._12_4_ = (uVar160 + uVar130) * 0x80;
    auVar83._0_4_ = uVar161 + uVar78 >> 0x19;
    auVar83._4_4_ = uVar131 + uVar80 >> 0x19;
    auVar83._8_4_ = uVar159 + uVar128 >> 0x19;
    auVar83._12_4_ = uVar160 + uVar130 >> 0x19;
    auVar83 = auVar83 ^ auVar132 ^ auVar90;
    iVar165 = auVar83._0_4_;
    iVar162 = auVar83._4_4_;
    iVar168 = auVar83._8_4_;
    iVar169 = auVar83._12_4_;
    auVar133._0_4_ = (iVar165 + uVar78) * 0x200;
    auVar133._4_4_ = (iVar162 + uVar80) * 0x200;
    auVar133._8_4_ = (iVar168 + uVar128) * 0x200;
    auVar133._12_4_ = (iVar169 + uVar130) * 0x200;
    auVar91._0_4_ = iVar165 + uVar78 >> 0x17;
    auVar91._4_4_ = iVar162 + uVar80 >> 0x17;
    auVar91._8_4_ = iVar168 + uVar128 >> 0x17;
    auVar91._12_4_ = iVar169 + uVar130 >> 0x17;
    auVar91 = auVar91 ^ auVar133 ^ auVar68;
    iVar163 = auVar91._0_4_;
    iVar164 = auVar91._4_4_;
    uVar67 = auVar91._8_4_ + iVar168;
    uVar79 = auVar91._12_4_ + iVar169;
    auVar134._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar134._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar134._8_4_ = uVar67 >> 0x13;
    auVar134._12_4_ = uVar79 >> 0x13;
    auVar69._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar69._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar69._8_4_ = uVar67 * 0x2000;
    auVar69._12_4_ = uVar79 * 0x2000;
    auVar70 = (auVar69 | auVar134) ^ auVar70;
    auVar99._0_12_ = auVar70._4_12_;
    auVar99._12_4_ = auVar70._0_4_;
    uVar67 = auVar70._0_4_ + iVar163;
    uVar79 = auVar70._4_4_ + iVar164;
    uVar65 = auVar70._8_4_ + auVar91._8_4_;
    uVar66 = auVar70._12_4_ + auVar91._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar56._0_8_ = auVar91._8_8_;
    auVar56._8_4_ = iVar163;
    auVar56._12_4_ = iVar164;
    auVar58._4_4_ = iVar165;
    auVar58._0_4_ = iVar169;
    auVar58._8_4_ = iVar162;
    auVar58._12_4_ = iVar168;
    auVar135._0_4_ = (iVar169 + uVar78) * 0x80;
    auVar135._4_4_ = (iVar165 + uVar80) * 0x80;
    auVar135._8_4_ = (iVar162 + uVar128) * 0x80;
    auVar135._12_4_ = (iVar168 + uVar130) * 0x80;
    auVar84._0_4_ = iVar169 + uVar78 >> 0x19;
    auVar84._4_4_ = iVar165 + uVar80 >> 0x19;
    auVar84._8_4_ = iVar162 + uVar128 >> 0x19;
    auVar84._12_4_ = iVar168 + uVar130 >> 0x19;
    auVar84 = auVar84 ^ auVar135 ^ auVar99;
    iVar165 = auVar84._0_4_;
    iVar162 = auVar84._4_4_;
    iVar168 = auVar84._8_4_;
    iVar169 = auVar84._12_4_;
    auVar136._0_4_ = (iVar165 + uVar78) * 0x200;
    auVar136._4_4_ = (iVar162 + uVar80) * 0x200;
    auVar136._8_4_ = (iVar168 + uVar128) * 0x200;
    auVar136._12_4_ = (iVar169 + uVar130) * 0x200;
    auVar100._0_4_ = iVar165 + uVar78 >> 0x17;
    auVar100._4_4_ = iVar162 + uVar80 >> 0x17;
    auVar100._8_4_ = iVar168 + uVar128 >> 0x17;
    auVar100._12_4_ = iVar169 + uVar130 >> 0x17;
    auVar100 = auVar100 ^ auVar136 ^ auVar56;
    iVar163 = auVar100._0_4_;
    iVar164 = auVar100._4_4_;
    uVar67 = auVar100._8_4_ + iVar168;
    uVar79 = auVar100._12_4_ + iVar169;
    auVar137._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar137._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar137._8_4_ = uVar67 >> 0x13;
    auVar137._12_4_ = uVar79 >> 0x13;
    auVar57._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar57._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar57._8_4_ = uVar67 * 0x2000;
    auVar57._12_4_ = uVar79 * 0x2000;
    auVar58 = (auVar57 | auVar137) ^ auVar58;
    auVar92._0_12_ = auVar58._4_12_;
    auVar92._12_4_ = auVar58._0_4_;
    uVar67 = auVar58._0_4_ + iVar163;
    uVar79 = auVar58._4_4_ + iVar164;
    uVar65 = auVar58._8_4_ + auVar100._8_4_;
    uVar66 = auVar58._12_4_ + auVar100._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar73._4_4_ = iVar165;
    auVar73._0_4_ = iVar169;
    auVar73._8_4_ = iVar162;
    auVar73._12_4_ = iVar168;
    auVar71._0_8_ = auVar100._8_8_;
    auVar71._8_4_ = iVar163;
    auVar71._12_4_ = iVar164;
    auVar101._0_4_ = (iVar169 + uVar78) * 0x80;
    auVar101._4_4_ = (iVar165 + uVar80) * 0x80;
    auVar101._8_4_ = (iVar162 + uVar128) * 0x80;
    auVar101._12_4_ = (iVar168 + uVar130) * 0x80;
    auVar85._0_4_ = iVar169 + uVar78 >> 0x19;
    auVar85._4_4_ = iVar165 + uVar80 >> 0x19;
    auVar85._8_4_ = iVar162 + uVar128 >> 0x19;
    auVar85._12_4_ = iVar168 + uVar130 >> 0x19;
    auVar85 = auVar85 ^ auVar101 ^ auVar92;
    iVar165 = auVar85._0_4_;
    iVar162 = auVar85._4_4_;
    iVar168 = auVar85._8_4_;
    iVar169 = auVar85._12_4_;
    auVar102._0_4_ = (iVar165 + uVar78) * 0x200;
    auVar102._4_4_ = (iVar162 + uVar80) * 0x200;
    auVar102._8_4_ = (iVar168 + uVar128) * 0x200;
    auVar102._12_4_ = (iVar169 + uVar130) * 0x200;
    auVar93._0_4_ = iVar165 + uVar78 >> 0x17;
    auVar93._4_4_ = iVar162 + uVar80 >> 0x17;
    auVar93._8_4_ = iVar168 + uVar128 >> 0x17;
    auVar93._12_4_ = iVar169 + uVar130 >> 0x17;
    auVar93 = auVar93 ^ auVar102 ^ auVar71;
    iVar163 = auVar93._0_4_;
    iVar164 = auVar93._4_4_;
    uVar67 = auVar93._8_4_ + iVar168;
    uVar79 = auVar93._12_4_ + iVar169;
    auVar103._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar103._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar103._8_4_ = uVar67 >> 0x13;
    auVar103._12_4_ = uVar79 >> 0x13;
    auVar72._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar72._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar72._8_4_ = uVar67 * 0x2000;
    auVar72._12_4_ = uVar79 * 0x2000;
    auVar73 = (auVar72 | auVar103) ^ auVar73;
    auVar104._0_12_ = auVar73._4_12_;
    auVar104._12_4_ = auVar73._0_4_;
    uVar67 = auVar73._0_4_ + iVar163;
    uVar79 = auVar73._4_4_ + iVar164;
    uVar65 = auVar73._8_4_ + auVar93._8_4_;
    uVar66 = auVar73._12_4_ + auVar93._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar59._0_8_ = auVar93._8_8_;
    auVar59._8_4_ = iVar163;
    auVar59._12_4_ = iVar164;
    auVar61._4_4_ = iVar165;
    auVar61._0_4_ = iVar169;
    auVar61._8_4_ = iVar162;
    auVar61._12_4_ = iVar168;
    auVar138._0_4_ = (iVar169 + uVar78) * 0x80;
    auVar138._4_4_ = (iVar165 + uVar80) * 0x80;
    auVar138._8_4_ = (iVar162 + uVar128) * 0x80;
    auVar138._12_4_ = (iVar168 + uVar130) * 0x80;
    auVar86._0_4_ = iVar169 + uVar78 >> 0x19;
    auVar86._4_4_ = iVar165 + uVar80 >> 0x19;
    auVar86._8_4_ = iVar162 + uVar128 >> 0x19;
    auVar86._12_4_ = iVar168 + uVar130 >> 0x19;
    auVar86 = auVar86 ^ auVar138 ^ auVar104;
    iVar165 = auVar86._0_4_;
    iVar162 = auVar86._4_4_;
    iVar168 = auVar86._8_4_;
    iVar169 = auVar86._12_4_;
    auVar139._0_4_ = (iVar165 + uVar78) * 0x200;
    auVar139._4_4_ = (iVar162 + uVar80) * 0x200;
    auVar139._8_4_ = (iVar168 + uVar128) * 0x200;
    auVar139._12_4_ = (iVar169 + uVar130) * 0x200;
    auVar105._0_4_ = iVar165 + uVar78 >> 0x17;
    auVar105._4_4_ = iVar162 + uVar80 >> 0x17;
    auVar105._8_4_ = iVar168 + uVar128 >> 0x17;
    auVar105._12_4_ = iVar169 + uVar130 >> 0x17;
    auVar105 = auVar105 ^ auVar139 ^ auVar59;
    iVar163 = auVar105._0_4_;
    iVar164 = auVar105._4_4_;
    uVar67 = auVar105._8_4_ + iVar168;
    uVar79 = auVar105._12_4_ + iVar169;
    auVar140._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar140._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar140._8_4_ = uVar67 >> 0x13;
    auVar140._12_4_ = uVar79 >> 0x13;
    auVar60._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar60._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar60._8_4_ = uVar67 * 0x2000;
    auVar60._12_4_ = uVar79 * 0x2000;
    auVar61 = (auVar60 | auVar140) ^ auVar61;
    auVar94._0_12_ = auVar61._4_12_;
    auVar94._12_4_ = auVar61._0_4_;
    uVar67 = auVar61._0_4_ + iVar163;
    uVar79 = auVar61._4_4_ + iVar164;
    uVar65 = auVar61._8_4_ + auVar105._8_4_;
    uVar66 = auVar61._12_4_ + auVar105._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar76._4_4_ = iVar165;
    auVar76._0_4_ = iVar169;
    auVar76._8_4_ = iVar162;
    auVar76._12_4_ = iVar168;
    auVar74._0_8_ = auVar105._8_8_;
    auVar74._8_4_ = iVar163;
    auVar74._12_4_ = iVar164;
    auVar106._0_4_ = (iVar169 + uVar78) * 0x80;
    auVar106._4_4_ = (iVar165 + uVar80) * 0x80;
    auVar106._8_4_ = (iVar162 + uVar128) * 0x80;
    auVar106._12_4_ = (iVar168 + uVar130) * 0x80;
    auVar87._0_4_ = iVar169 + uVar78 >> 0x19;
    auVar87._4_4_ = iVar165 + uVar80 >> 0x19;
    auVar87._8_4_ = iVar162 + uVar128 >> 0x19;
    auVar87._12_4_ = iVar168 + uVar130 >> 0x19;
    auVar87 = auVar87 ^ auVar106 ^ auVar94;
    iVar165 = auVar87._0_4_;
    iVar162 = auVar87._4_4_;
    iVar168 = auVar87._8_4_;
    iVar169 = auVar87._12_4_;
    auVar107._0_4_ = (iVar165 + uVar78) * 0x200;
    auVar107._4_4_ = (iVar162 + uVar80) * 0x200;
    auVar107._8_4_ = (iVar168 + uVar128) * 0x200;
    auVar107._12_4_ = (iVar169 + uVar130) * 0x200;
    auVar95._0_4_ = iVar165 + uVar78 >> 0x17;
    auVar95._4_4_ = iVar162 + uVar80 >> 0x17;
    auVar95._8_4_ = iVar168 + uVar128 >> 0x17;
    auVar95._12_4_ = iVar169 + uVar130 >> 0x17;
    auVar95 = auVar95 ^ auVar107 ^ auVar74;
    iVar163 = auVar95._0_4_;
    iVar164 = auVar95._4_4_;
    uVar67 = auVar95._8_4_ + iVar168;
    uVar79 = auVar95._12_4_ + iVar169;
    auVar108._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar108._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar108._8_4_ = uVar67 >> 0x13;
    auVar108._12_4_ = uVar79 >> 0x13;
    auVar75._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar75._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar75._8_4_ = uVar67 * 0x2000;
    auVar75._12_4_ = uVar79 * 0x2000;
    auVar76 = (auVar75 | auVar108) ^ auVar76;
    auVar109._0_12_ = auVar76._4_12_;
    auVar109._12_4_ = auVar76._0_4_;
    uVar67 = auVar76._0_4_ + iVar163;
    uVar79 = auVar76._4_4_ + iVar164;
    uVar65 = auVar76._8_4_ + auVar95._8_4_;
    uVar66 = auVar76._12_4_ + auVar95._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar62._0_8_ = auVar95._8_8_;
    auVar62._8_4_ = iVar163;
    auVar62._12_4_ = iVar164;
    auVar64._4_4_ = iVar165;
    auVar64._0_4_ = iVar169;
    auVar64._8_4_ = iVar162;
    auVar64._12_4_ = iVar168;
    auVar141._0_4_ = (iVar169 + uVar78) * 0x80;
    auVar141._4_4_ = (iVar165 + uVar80) * 0x80;
    auVar141._8_4_ = (iVar162 + uVar128) * 0x80;
    auVar141._12_4_ = (iVar168 + uVar130) * 0x80;
    auVar88._0_4_ = iVar169 + uVar78 >> 0x19;
    auVar88._4_4_ = iVar165 + uVar80 >> 0x19;
    auVar88._8_4_ = iVar162 + uVar128 >> 0x19;
    auVar88._12_4_ = iVar168 + uVar130 >> 0x19;
    auVar88 = auVar88 ^ auVar141 ^ auVar109;
    uVar131 = auVar88._0_4_;
    uVar159 = auVar88._4_4_;
    uVar160 = auVar88._8_4_;
    uVar161 = auVar88._12_4_;
    auVar142._0_4_ = (uVar131 + uVar78) * 0x200;
    auVar142._4_4_ = (uVar159 + uVar80) * 0x200;
    auVar142._8_4_ = (uVar160 + uVar128) * 0x200;
    auVar142._12_4_ = (uVar161 + uVar130) * 0x200;
    auVar110._0_4_ = uVar131 + uVar78 >> 0x17;
    auVar110._4_4_ = uVar159 + uVar80 >> 0x17;
    auVar110._8_4_ = uVar160 + uVar128 >> 0x17;
    auVar110._12_4_ = uVar161 + uVar130 >> 0x17;
    auVar110 = auVar110 ^ auVar142 ^ auVar62;
    iVar163 = auVar110._0_4_;
    iVar164 = auVar110._4_4_;
    uVar67 = auVar110._8_4_ + uVar160;
    uVar79 = auVar110._12_4_ + uVar161;
    auVar143._0_4_ = iVar163 + uVar131 >> 0x13;
    auVar143._4_4_ = iVar164 + uVar159 >> 0x13;
    auVar143._8_4_ = uVar67 >> 0x13;
    auVar143._12_4_ = uVar79 >> 0x13;
    auVar63._0_4_ = (iVar163 + uVar131) * 0x2000;
    auVar63._4_4_ = (iVar164 + uVar159) * 0x2000;
    auVar63._8_4_ = uVar67 * 0x2000;
    auVar63._12_4_ = uVar79 * 0x2000;
    auVar64 = (auVar63 | auVar143) ^ auVar64;
    auVar96._0_12_ = auVar64._4_12_;
    auVar96._12_4_ = auVar64._0_4_;
    uVar67 = auVar64._0_4_ + iVar163;
    uVar79 = auVar64._4_4_ + iVar164;
    uVar65 = auVar64._8_4_ + auVar110._8_4_;
    uVar66 = auVar64._12_4_ + auVar110._12_4_;
    uVar78 = (uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78;
    uVar80 = (uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80;
    uVar128 = (uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128;
    uVar130 = (uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130;
    auVar111._0_8_ = auVar110._8_8_;
    auVar111._8_4_ = iVar163;
    auVar111._12_4_ = iVar164;
    auVar144._0_4_ = (uVar161 + uVar78) * 0x80;
    auVar144._4_4_ = (uVar131 + uVar80) * 0x80;
    auVar144._8_4_ = (uVar159 + uVar128) * 0x80;
    auVar144._12_4_ = (uVar160 + uVar130) * 0x80;
    auVar77._0_4_ = uVar161 + uVar78 >> 0x19;
    auVar77._4_4_ = uVar131 + uVar80 >> 0x19;
    auVar77._8_4_ = uVar159 + uVar128 >> 0x19;
    auVar77._12_4_ = uVar160 + uVar130 >> 0x19;
    auVar77 = auVar77 ^ auVar144 ^ auVar96;
    iVar163 = auVar77._0_4_;
    iVar164 = auVar77._4_4_;
    iVar165 = auVar77._8_4_;
    iVar162 = auVar77._12_4_;
    auVar145._0_4_ = (iVar163 + uVar78) * 0x200;
    auVar145._4_4_ = (iVar164 + uVar80) * 0x200;
    auVar145._8_4_ = (iVar165 + uVar128) * 0x200;
    auVar145._12_4_ = (iVar162 + uVar130) * 0x200;
    auVar97._0_4_ = iVar163 + uVar78 >> 0x17;
    auVar97._4_4_ = iVar164 + uVar80 >> 0x17;
    auVar97._8_4_ = iVar165 + uVar128 >> 0x17;
    auVar97._12_4_ = iVar162 + uVar130 >> 0x17;
    auVar97 = auVar97 ^ auVar145 ^ auVar111;
    iVar168 = auVar97._0_4_;
    iVar169 = auVar97._4_4_;
    iVar166 = auVar97._8_4_;
    iVar167 = auVar97._12_4_;
    uVar161 = ((iVar168 + iVar163) * 0x2000 | (uint)(iVar168 + iVar163) >> 0x13) ^ uVar161;
    uVar131 = ((iVar169 + iVar164) * 0x2000 | (uint)(iVar169 + iVar164) >> 0x13) ^ uVar131;
    uVar159 = ((iVar166 + iVar165) * 0x2000 | (uint)(iVar166 + iVar165) >> 0x13) ^ uVar159;
    uVar160 = ((iVar167 + iVar162) * 0x2000 | (uint)(iVar167 + iVar162) >> 0x13) ^ uVar160;
    uVar67 = uVar161 + iVar168;
    uVar79 = uVar131 + iVar169;
    uVar65 = uVar159 + iVar166;
    uVar66 = uVar160 + iVar167;
    uVar98 = ((uVar67 * 0x40000 | uVar67 >> 0xe) ^ uVar78) + uVar98;
    uVar126 = ((uVar79 * 0x40000 | uVar79 >> 0xe) ^ uVar80) + uVar126;
    uVar127 = ((uVar65 * 0x40000 | uVar65 >> 0xe) ^ uVar128) + uVar127;
    uVar129 = ((uVar66 * 0x40000 | uVar66 >> 0xe) ^ uVar130) + uVar129;
    puVar1 = (uint *)((long)Bout + lVar8 + -0x30);
    *puVar1 = uVar98;
    puVar1[1] = uVar126;
    puVar1[2] = uVar127;
    puVar1[3] = uVar129;
    uVar131 = uVar131 + uVar30;
    uVar159 = uVar159 + uVar31;
    uVar160 = uVar160 + uVar32;
    uVar161 = uVar161 + uVar20;
    puVar1 = (uint *)((long)Bout + lVar8 + -0x20);
    *puVar1 = uVar131;
    puVar1[1] = uVar159;
    puVar1[2] = uVar160;
    puVar1[3] = uVar161;
    iVar166 = iVar166 + auVar41._0_4_;
    iVar167 = iVar167 + auVar41._4_4_;
    iVar168 = iVar168 + auVar41._8_4_;
    iVar169 = iVar169 + auVar41._12_4_;
    piVar4 = (int *)((long)Bout + lVar8 + -0x10);
    *piVar4 = iVar166;
    piVar4[1] = iVar167;
    piVar4[2] = iVar168;
    piVar4[3] = iVar169;
    iVar162 = iVar162 + auVar33._0_4_;
    iVar163 = iVar163 + auVar33._4_4_;
    iVar164 = iVar164 + auVar33._8_4_;
    iVar165 = iVar165 + auVar33._12_4_;
    piVar4 = (int *)((long)Bout + lVar8);
    *piVar4 = iVar162;
    piVar4[1] = iVar163;
    piVar4[2] = iVar164;
    piVar4[3] = iVar165;
    puVar1 = (uint *)((long)Bin2 + lVar8 * 2 + -0x20);
    puVar2 = (uint *)((long)Bin2 + lVar8 * 2 + -0x10);
    puVar3 = (uint *)((long)Bin1 + lVar8 * 2 + -0x20);
    uVar98 = *puVar1 ^ *puVar3 ^ uVar98;
    uVar126 = puVar1[1] ^ puVar3[1] ^ uVar126;
    uVar127 = puVar1[2] ^ puVar3[2] ^ uVar127;
    uVar129 = puVar1[3] ^ puVar3[3] ^ uVar129;
    puVar1 = (uint *)((long)Bin1 + lVar8 * 2 + -0x10);
    uVar131 = *puVar2 ^ *puVar1 ^ uVar131;
    uVar159 = puVar2[1] ^ puVar1[1] ^ uVar159;
    uVar160 = puVar2[2] ^ puVar1[2] ^ uVar160;
    uVar161 = puVar2[3] ^ puVar1[3] ^ uVar161;
    auVar82._4_4_ = iVar167;
    auVar82._0_4_ = iVar166;
    auVar82._8_4_ = iVar168;
    auVar82._12_4_ = iVar169;
    auVar82 = *(undefined1 (*) [16])((long)Bin2 + lVar8 * 2) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar8 * 2) ^ auVar82;
    auVar55._4_4_ = iVar163;
    auVar55._0_4_ = iVar162;
    auVar55._8_4_ = iVar164;
    auVar55._12_4_ = iVar165;
    auVar55 = *(undefined1 (*) [16])((long)Bin2 + lVar8 * 2 + 0x10) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar8 * 2 + 0x10) ^ auVar55;
    uVar20 = uVar98 + auVar55._0_4_;
    uVar30 = uVar126 + auVar55._4_4_;
    uVar31 = uVar127 + auVar55._8_4_;
    uVar32 = uVar129 + auVar55._12_4_;
    uVar78 = (uVar20 * 0x80 | uVar20 >> 0x19) ^ uVar131;
    uVar80 = (uVar30 * 0x80 | uVar30 >> 0x19) ^ uVar159;
    uVar128 = (uVar31 * 0x80 | uVar31 >> 0x19) ^ uVar160;
    uVar130 = (uVar32 * 0x80 | uVar32 >> 0x19) ^ uVar161;
    auVar10._0_4_ = uVar78 + uVar98 >> 0x17;
    auVar10._4_4_ = uVar80 + uVar126 >> 0x17;
    auVar10._8_4_ = uVar128 + uVar127 >> 0x17;
    auVar10._12_4_ = uVar130 + uVar129 >> 0x17;
    auVar34._0_4_ = (uVar78 + uVar98) * 0x200;
    auVar34._4_4_ = (uVar80 + uVar126) * 0x200;
    auVar34._8_4_ = (uVar128 + uVar127) * 0x200;
    auVar34._12_4_ = (uVar130 + uVar129) * 0x200;
    auVar41 = (auVar34 | auVar10) ^ auVar82;
    iVar163 = auVar41._0_4_;
    iVar164 = auVar41._4_4_;
    uVar20 = auVar41._8_4_ + uVar128;
    uVar30 = auVar41._12_4_ + uVar130;
    auVar42._0_4_ = iVar163 + uVar78 >> 0x13;
    auVar42._4_4_ = iVar164 + uVar80 >> 0x13;
    auVar42._8_4_ = uVar20 >> 0x13;
    auVar42._12_4_ = uVar30 >> 0x13;
    auVar11._0_4_ = (iVar163 + uVar78) * 0x2000;
    auVar11._4_4_ = (iVar164 + uVar80) * 0x2000;
    auVar11._8_4_ = uVar20 * 0x2000;
    auVar11._12_4_ = uVar30 * 0x2000;
    auVar33 = (auVar11 | auVar42) ^ auVar55;
    auVar43._0_12_ = auVar33._4_12_;
    auVar43._12_4_ = auVar33._0_4_;
    uVar20 = auVar33._0_4_ + iVar163;
    uVar30 = auVar33._4_4_ + iVar164;
    uVar31 = auVar33._8_4_ + auVar41._8_4_;
    uVar32 = auVar33._12_4_ + auVar41._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar98;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar126;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar127;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar129;
    auVar23._4_4_ = uVar78;
    auVar23._0_4_ = uVar130;
    auVar23._8_4_ = uVar80;
    auVar23._12_4_ = uVar128;
    auVar21._0_8_ = auVar41._8_8_;
    auVar21._8_4_ = iVar163;
    auVar21._12_4_ = iVar164;
    auVar146._0_4_ = (uVar130 + uVar67) * 0x80;
    auVar146._4_4_ = (uVar78 + uVar79) * 0x80;
    auVar146._8_4_ = (uVar80 + uVar65) * 0x80;
    auVar146._12_4_ = (uVar128 + uVar66) * 0x80;
    auVar35._0_4_ = uVar130 + uVar67 >> 0x19;
    auVar35._4_4_ = uVar78 + uVar79 >> 0x19;
    auVar35._8_4_ = uVar80 + uVar65 >> 0x19;
    auVar35._12_4_ = uVar128 + uVar66 >> 0x19;
    auVar35 = auVar35 ^ auVar146 ^ auVar43;
    iVar165 = auVar35._0_4_;
    iVar162 = auVar35._4_4_;
    iVar168 = auVar35._8_4_;
    iVar169 = auVar35._12_4_;
    auVar147._0_4_ = (iVar165 + uVar67) * 0x200;
    auVar147._4_4_ = (iVar162 + uVar79) * 0x200;
    auVar147._8_4_ = (iVar168 + uVar65) * 0x200;
    auVar147._12_4_ = (iVar169 + uVar66) * 0x200;
    auVar44._0_4_ = iVar165 + uVar67 >> 0x17;
    auVar44._4_4_ = iVar162 + uVar79 >> 0x17;
    auVar44._8_4_ = iVar168 + uVar65 >> 0x17;
    auVar44._12_4_ = iVar169 + uVar66 >> 0x17;
    auVar44 = auVar44 ^ auVar147 ^ auVar21;
    iVar163 = auVar44._0_4_;
    iVar164 = auVar44._4_4_;
    uVar20 = auVar44._8_4_ + iVar168;
    uVar30 = auVar44._12_4_ + iVar169;
    auVar148._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar148._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar148._8_4_ = uVar20 >> 0x13;
    auVar148._12_4_ = uVar30 >> 0x13;
    auVar22._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar22._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar22._8_4_ = uVar20 * 0x2000;
    auVar22._12_4_ = uVar30 * 0x2000;
    auVar23 = (auVar22 | auVar148) ^ auVar23;
    auVar112._0_12_ = auVar23._4_12_;
    auVar112._12_4_ = auVar23._0_4_;
    uVar20 = auVar23._0_4_ + iVar163;
    uVar30 = auVar23._4_4_ + iVar164;
    uVar31 = auVar23._8_4_ + auVar44._8_4_;
    uVar32 = auVar23._12_4_ + auVar44._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar67;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar79;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar65;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar66;
    auVar12._0_8_ = auVar44._8_8_;
    auVar12._8_4_ = iVar163;
    auVar12._12_4_ = iVar164;
    auVar14._4_4_ = iVar165;
    auVar14._0_4_ = iVar169;
    auVar14._8_4_ = iVar162;
    auVar14._12_4_ = iVar168;
    auVar149._0_4_ = (iVar169 + uVar67) * 0x80;
    auVar149._4_4_ = (iVar165 + uVar79) * 0x80;
    auVar149._8_4_ = (iVar162 + uVar65) * 0x80;
    auVar149._12_4_ = (iVar168 + uVar66) * 0x80;
    auVar36._0_4_ = iVar169 + uVar67 >> 0x19;
    auVar36._4_4_ = iVar165 + uVar79 >> 0x19;
    auVar36._8_4_ = iVar162 + uVar65 >> 0x19;
    auVar36._12_4_ = iVar168 + uVar66 >> 0x19;
    auVar36 = auVar36 ^ auVar149 ^ auVar112;
    iVar165 = auVar36._0_4_;
    iVar162 = auVar36._4_4_;
    iVar168 = auVar36._8_4_;
    iVar169 = auVar36._12_4_;
    auVar150._0_4_ = (iVar165 + uVar67) * 0x200;
    auVar150._4_4_ = (iVar162 + uVar79) * 0x200;
    auVar150._8_4_ = (iVar168 + uVar65) * 0x200;
    auVar150._12_4_ = (iVar169 + uVar66) * 0x200;
    auVar113._0_4_ = iVar165 + uVar67 >> 0x17;
    auVar113._4_4_ = iVar162 + uVar79 >> 0x17;
    auVar113._8_4_ = iVar168 + uVar65 >> 0x17;
    auVar113._12_4_ = iVar169 + uVar66 >> 0x17;
    auVar113 = auVar113 ^ auVar150 ^ auVar12;
    iVar163 = auVar113._0_4_;
    iVar164 = auVar113._4_4_;
    uVar20 = auVar113._8_4_ + iVar168;
    uVar30 = auVar113._12_4_ + iVar169;
    auVar151._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar151._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar151._8_4_ = uVar20 >> 0x13;
    auVar151._12_4_ = uVar30 >> 0x13;
    auVar13._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar13._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar13._8_4_ = uVar20 * 0x2000;
    auVar13._12_4_ = uVar30 * 0x2000;
    auVar14 = (auVar13 | auVar151) ^ auVar14;
    auVar45._0_12_ = auVar14._4_12_;
    auVar45._12_4_ = auVar14._0_4_;
    uVar20 = auVar14._0_4_ + iVar163;
    uVar30 = auVar14._4_4_ + iVar164;
    uVar31 = auVar14._8_4_ + auVar113._8_4_;
    uVar32 = auVar14._12_4_ + auVar113._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar67;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar79;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar65;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar66;
    auVar26._4_4_ = iVar165;
    auVar26._0_4_ = iVar169;
    auVar26._8_4_ = iVar162;
    auVar26._12_4_ = iVar168;
    auVar24._0_8_ = auVar113._8_8_;
    auVar24._8_4_ = iVar163;
    auVar24._12_4_ = iVar164;
    auVar114._0_4_ = (iVar169 + uVar67) * 0x80;
    auVar114._4_4_ = (iVar165 + uVar79) * 0x80;
    auVar114._8_4_ = (iVar162 + uVar65) * 0x80;
    auVar114._12_4_ = (iVar168 + uVar66) * 0x80;
    auVar37._0_4_ = iVar169 + uVar67 >> 0x19;
    auVar37._4_4_ = iVar165 + uVar79 >> 0x19;
    auVar37._8_4_ = iVar162 + uVar65 >> 0x19;
    auVar37._12_4_ = iVar168 + uVar66 >> 0x19;
    auVar37 = auVar37 ^ auVar114 ^ auVar45;
    iVar165 = auVar37._0_4_;
    iVar162 = auVar37._4_4_;
    iVar168 = auVar37._8_4_;
    iVar169 = auVar37._12_4_;
    auVar115._0_4_ = (iVar165 + uVar67) * 0x200;
    auVar115._4_4_ = (iVar162 + uVar79) * 0x200;
    auVar115._8_4_ = (iVar168 + uVar65) * 0x200;
    auVar115._12_4_ = (iVar169 + uVar66) * 0x200;
    auVar46._0_4_ = iVar165 + uVar67 >> 0x17;
    auVar46._4_4_ = iVar162 + uVar79 >> 0x17;
    auVar46._8_4_ = iVar168 + uVar65 >> 0x17;
    auVar46._12_4_ = iVar169 + uVar66 >> 0x17;
    auVar46 = auVar46 ^ auVar115 ^ auVar24;
    iVar163 = auVar46._0_4_;
    iVar164 = auVar46._4_4_;
    uVar20 = auVar46._8_4_ + iVar168;
    uVar30 = auVar46._12_4_ + iVar169;
    auVar116._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar116._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar116._8_4_ = uVar20 >> 0x13;
    auVar116._12_4_ = uVar30 >> 0x13;
    auVar25._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar25._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar25._8_4_ = uVar20 * 0x2000;
    auVar25._12_4_ = uVar30 * 0x2000;
    auVar26 = (auVar25 | auVar116) ^ auVar26;
    auVar117._0_12_ = auVar26._4_12_;
    auVar117._12_4_ = auVar26._0_4_;
    uVar20 = auVar26._0_4_ + iVar163;
    uVar30 = auVar26._4_4_ + iVar164;
    uVar31 = auVar26._8_4_ + auVar46._8_4_;
    uVar32 = auVar26._12_4_ + auVar46._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar67;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar79;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar65;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar66;
    auVar15._0_8_ = auVar46._8_8_;
    auVar15._8_4_ = iVar163;
    auVar15._12_4_ = iVar164;
    auVar17._4_4_ = iVar165;
    auVar17._0_4_ = iVar169;
    auVar17._8_4_ = iVar162;
    auVar17._12_4_ = iVar168;
    auVar152._0_4_ = (iVar169 + uVar67) * 0x80;
    auVar152._4_4_ = (iVar165 + uVar79) * 0x80;
    auVar152._8_4_ = (iVar162 + uVar65) * 0x80;
    auVar152._12_4_ = (iVar168 + uVar66) * 0x80;
    auVar38._0_4_ = iVar169 + uVar67 >> 0x19;
    auVar38._4_4_ = iVar165 + uVar79 >> 0x19;
    auVar38._8_4_ = iVar162 + uVar65 >> 0x19;
    auVar38._12_4_ = iVar168 + uVar66 >> 0x19;
    auVar38 = auVar38 ^ auVar152 ^ auVar117;
    iVar165 = auVar38._0_4_;
    iVar162 = auVar38._4_4_;
    iVar168 = auVar38._8_4_;
    iVar169 = auVar38._12_4_;
    auVar153._0_4_ = (iVar165 + uVar67) * 0x200;
    auVar153._4_4_ = (iVar162 + uVar79) * 0x200;
    auVar153._8_4_ = (iVar168 + uVar65) * 0x200;
    auVar153._12_4_ = (iVar169 + uVar66) * 0x200;
    auVar118._0_4_ = iVar165 + uVar67 >> 0x17;
    auVar118._4_4_ = iVar162 + uVar79 >> 0x17;
    auVar118._8_4_ = iVar168 + uVar65 >> 0x17;
    auVar118._12_4_ = iVar169 + uVar66 >> 0x17;
    auVar118 = auVar118 ^ auVar153 ^ auVar15;
    iVar163 = auVar118._0_4_;
    iVar164 = auVar118._4_4_;
    uVar20 = auVar118._8_4_ + iVar168;
    uVar30 = auVar118._12_4_ + iVar169;
    auVar154._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar154._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar154._8_4_ = uVar20 >> 0x13;
    auVar154._12_4_ = uVar30 >> 0x13;
    auVar16._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar16._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar16._8_4_ = uVar20 * 0x2000;
    auVar16._12_4_ = uVar30 * 0x2000;
    auVar17 = (auVar16 | auVar154) ^ auVar17;
    auVar47._0_12_ = auVar17._4_12_;
    auVar47._12_4_ = auVar17._0_4_;
    uVar20 = auVar17._0_4_ + iVar163;
    uVar30 = auVar17._4_4_ + iVar164;
    uVar31 = auVar17._8_4_ + auVar118._8_4_;
    uVar32 = auVar17._12_4_ + auVar118._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar67;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar79;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar65;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar66;
    auVar29._4_4_ = iVar165;
    auVar29._0_4_ = iVar169;
    auVar29._8_4_ = iVar162;
    auVar29._12_4_ = iVar168;
    auVar27._0_8_ = auVar118._8_8_;
    auVar27._8_4_ = iVar163;
    auVar27._12_4_ = iVar164;
    auVar119._0_4_ = (iVar169 + uVar67) * 0x80;
    auVar119._4_4_ = (iVar165 + uVar79) * 0x80;
    auVar119._8_4_ = (iVar162 + uVar65) * 0x80;
    auVar119._12_4_ = (iVar168 + uVar66) * 0x80;
    auVar39._0_4_ = iVar169 + uVar67 >> 0x19;
    auVar39._4_4_ = iVar165 + uVar79 >> 0x19;
    auVar39._8_4_ = iVar162 + uVar65 >> 0x19;
    auVar39._12_4_ = iVar168 + uVar66 >> 0x19;
    auVar39 = auVar39 ^ auVar119 ^ auVar47;
    iVar165 = auVar39._0_4_;
    iVar162 = auVar39._4_4_;
    iVar168 = auVar39._8_4_;
    iVar169 = auVar39._12_4_;
    auVar120._0_4_ = (iVar165 + uVar67) * 0x200;
    auVar120._4_4_ = (iVar162 + uVar79) * 0x200;
    auVar120._8_4_ = (iVar168 + uVar65) * 0x200;
    auVar120._12_4_ = (iVar169 + uVar66) * 0x200;
    auVar48._0_4_ = iVar165 + uVar67 >> 0x17;
    auVar48._4_4_ = iVar162 + uVar79 >> 0x17;
    auVar48._8_4_ = iVar168 + uVar65 >> 0x17;
    auVar48._12_4_ = iVar169 + uVar66 >> 0x17;
    auVar48 = auVar48 ^ auVar120 ^ auVar27;
    iVar163 = auVar48._0_4_;
    iVar164 = auVar48._4_4_;
    uVar20 = auVar48._8_4_ + iVar168;
    uVar30 = auVar48._12_4_ + iVar169;
    auVar121._0_4_ = (uint)(iVar163 + iVar165) >> 0x13;
    auVar121._4_4_ = (uint)(iVar164 + iVar162) >> 0x13;
    auVar121._8_4_ = uVar20 >> 0x13;
    auVar121._12_4_ = uVar30 >> 0x13;
    auVar28._0_4_ = (iVar163 + iVar165) * 0x2000;
    auVar28._4_4_ = (iVar164 + iVar162) * 0x2000;
    auVar28._8_4_ = uVar20 * 0x2000;
    auVar28._12_4_ = uVar30 * 0x2000;
    auVar29 = (auVar28 | auVar121) ^ auVar29;
    auVar122._0_12_ = auVar29._4_12_;
    auVar122._12_4_ = auVar29._0_4_;
    uVar20 = auVar29._0_4_ + iVar163;
    uVar30 = auVar29._4_4_ + iVar164;
    uVar31 = auVar29._8_4_ + auVar48._8_4_;
    uVar32 = auVar29._12_4_ + auVar48._12_4_;
    uVar67 = (uVar20 * 0x40000 | uVar20 >> 0xe) ^ uVar67;
    uVar79 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar79;
    uVar65 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar65;
    uVar66 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar66;
    auVar49._0_8_ = auVar48._8_8_;
    auVar49._8_4_ = iVar163;
    auVar49._12_4_ = iVar164;
    auVar125._4_4_ = iVar165;
    auVar125._0_4_ = iVar169;
    auVar125._8_4_ = iVar162;
    auVar125._12_4_ = iVar168;
    auVar155._0_4_ = (iVar169 + uVar67) * 0x80;
    auVar155._4_4_ = (iVar165 + uVar79) * 0x80;
    auVar155._8_4_ = (iVar162 + uVar65) * 0x80;
    auVar155._12_4_ = (iVar168 + uVar66) * 0x80;
    auVar18._0_4_ = iVar169 + uVar67 >> 0x19;
    auVar18._4_4_ = iVar165 + uVar79 >> 0x19;
    auVar18._8_4_ = iVar162 + uVar65 >> 0x19;
    auVar18._12_4_ = iVar168 + uVar66 >> 0x19;
    auVar18 = auVar18 ^ auVar155 ^ auVar122;
    uVar30 = auVar18._0_4_;
    uVar31 = auVar18._4_4_;
    uVar32 = auVar18._8_4_;
    uVar20 = auVar18._12_4_;
    auVar123._0_4_ = (uVar30 + uVar67) * 0x200;
    auVar123._4_4_ = (uVar31 + uVar79) * 0x200;
    auVar123._8_4_ = (uVar32 + uVar65) * 0x200;
    auVar123._12_4_ = (uVar20 + uVar66) * 0x200;
    auVar156._0_4_ = uVar30 + uVar67 >> 0x17;
    auVar156._4_4_ = uVar31 + uVar79 >> 0x17;
    auVar156._8_4_ = uVar32 + uVar65 >> 0x17;
    auVar156._12_4_ = uVar20 + uVar66 >> 0x17;
    auVar156 = auVar156 ^ auVar123 ^ auVar49;
    iVar163 = auVar156._0_4_;
    iVar164 = auVar156._4_4_;
    uVar78 = auVar156._8_4_ + uVar32;
    uVar80 = auVar156._12_4_ + uVar20;
    auVar50._0_4_ = iVar163 + uVar30 >> 0x13;
    auVar50._4_4_ = iVar164 + uVar31 >> 0x13;
    auVar50._8_4_ = uVar78 >> 0x13;
    auVar50._12_4_ = uVar80 >> 0x13;
    auVar124._0_4_ = (iVar163 + uVar30) * 0x2000;
    auVar124._4_4_ = (iVar164 + uVar31) * 0x2000;
    auVar124._8_4_ = uVar78 * 0x2000;
    auVar124._12_4_ = uVar80 * 0x2000;
    auVar125 = (auVar124 | auVar50) ^ auVar125;
    auVar51._0_12_ = auVar125._4_12_;
    auVar51._12_4_ = auVar125._0_4_;
    uVar78 = auVar125._0_4_ + iVar163;
    uVar80 = auVar125._4_4_ + iVar164;
    uVar128 = auVar125._8_4_ + auVar156._8_4_;
    uVar130 = auVar125._12_4_ + auVar156._12_4_;
    uVar67 = (uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar67;
    uVar79 = (uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar79;
    uVar65 = (uVar128 * 0x40000 | uVar128 >> 0xe) ^ uVar65;
    uVar66 = (uVar130 * 0x40000 | uVar130 >> 0xe) ^ uVar66;
    auVar19._0_8_ = auVar156._8_8_;
    auVar19._8_4_ = iVar163;
    auVar19._12_4_ = iVar164;
    auVar157._0_4_ = (uVar20 + uVar67) * 0x80;
    auVar157._4_4_ = (uVar30 + uVar79) * 0x80;
    auVar157._8_4_ = (uVar31 + uVar65) * 0x80;
    auVar157._12_4_ = (uVar32 + uVar66) * 0x80;
    auVar40._0_4_ = uVar20 + uVar67 >> 0x19;
    auVar40._4_4_ = uVar30 + uVar79 >> 0x19;
    auVar40._8_4_ = uVar31 + uVar65 >> 0x19;
    auVar40._12_4_ = uVar32 + uVar66 >> 0x19;
    auVar40 = auVar40 ^ auVar157 ^ auVar51;
    iVar168 = auVar40._0_4_;
    iVar169 = auVar40._4_4_;
    iVar166 = auVar40._8_4_;
    iVar167 = auVar40._12_4_;
    auVar158._0_4_ = (iVar168 + uVar67) * 0x200;
    auVar158._4_4_ = (iVar169 + uVar79) * 0x200;
    auVar158._8_4_ = (iVar166 + uVar65) * 0x200;
    auVar158._12_4_ = (iVar167 + uVar66) * 0x200;
    auVar52._0_4_ = iVar168 + uVar67 >> 0x17;
    auVar52._4_4_ = iVar169 + uVar79 >> 0x17;
    auVar52._8_4_ = iVar166 + uVar65 >> 0x17;
    auVar52._12_4_ = iVar167 + uVar66 >> 0x17;
    auVar52 = auVar52 ^ auVar158 ^ auVar19;
    iVar163 = auVar52._0_4_;
    iVar164 = auVar52._4_4_;
    iVar165 = auVar52._8_4_;
    iVar162 = auVar52._12_4_;
    uVar20 = ((iVar163 + iVar168) * 0x2000 | (uint)(iVar163 + iVar168) >> 0x13) ^ uVar20;
    uVar30 = ((iVar164 + iVar169) * 0x2000 | (uint)(iVar164 + iVar169) >> 0x13) ^ uVar30;
    uVar31 = ((iVar165 + iVar166) * 0x2000 | (uint)(iVar165 + iVar166) >> 0x13) ^ uVar31;
    uVar32 = ((iVar162 + iVar167) * 0x2000 | (uint)(iVar162 + iVar167) >> 0x13) ^ uVar32;
    uVar78 = uVar20 + iVar163;
    uVar80 = uVar30 + iVar164;
    uVar128 = uVar31 + iVar165;
    uVar130 = uVar32 + iVar162;
    uVar98 = ((uVar78 * 0x40000 | uVar78 >> 0xe) ^ uVar67) + uVar98;
    uVar126 = ((uVar80 * 0x40000 | uVar80 >> 0xe) ^ uVar79) + uVar126;
    uVar127 = ((uVar128 * 0x40000 | uVar128 >> 0xe) ^ uVar65) + uVar127;
    uVar129 = ((uVar130 * 0x40000 | uVar130 >> 0xe) ^ uVar66) + uVar129;
    puVar5 = (uint32_t *)((long)Bout + lVar8 + r * 0x40 + -0x30);
    *puVar5 = uVar98;
    puVar5[1] = uVar126;
    puVar5[2] = uVar127;
    puVar5[3] = uVar129;
    uVar30 = uVar30 + uVar131;
    uVar31 = uVar31 + uVar159;
    uVar32 = uVar32 + uVar160;
    uVar20 = uVar20 + uVar161;
    puVar1 = (uint *)((long)Bout + lVar8 + r * 0x40 + -0x20);
    *puVar1 = uVar30;
    puVar1[1] = uVar31;
    puVar1[2] = uVar32;
    puVar1[3] = uVar20;
    auVar41._0_4_ = iVar165 + auVar82._0_4_;
    auVar41._4_4_ = iVar162 + auVar82._4_4_;
    auVar41._8_4_ = iVar163 + auVar82._8_4_;
    auVar41._12_4_ = iVar164 + auVar82._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar8 + r * 0x40 + -0x10) = auVar41;
    auVar33._0_4_ = iVar167 + auVar55._0_4_;
    auVar33._4_4_ = iVar168 + auVar55._4_4_;
    auVar33._8_4_ = iVar169 + auVar55._8_4_;
    auVar33._12_4_ = iVar166 + auVar55._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar8 + r * 0x40) = auVar33;
    lVar8 = lVar8 + 0x40;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  return uVar98;
}

Assistant:

static uint32_t
blockmix_salsa8_xor(const salsa20_blk_t *restrict Bin1,
    const salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin2[r * 2 + 1], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin2[i * 2 + 1], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin2[r * 2], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	XOR4_2(Bin1[r * 2 + 1].q, Bin2[r * 2 + 1].q)

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2 + 1].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2 + 1].q, Bout[r + 1 + i].q)
	}

	return _mm_cvtsi128_si32(X0);
}